

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O2

bool hwl::space(state *ps)

{
  bool bVar1;
  long lVar2;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *local_20;
  
  local_78._8_8_ = &local_98;
  local_98._M_unused._M_object = &local_58;
  local_58._8_8_ = 0;
  local_58._M_unused._M_member_pointer = 0x20;
  local_40 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_manager;
  uStack_30 = 0;
  local_38 = 9;
  local_20 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_manager;
  local_98._8_8_ = 2;
  local_80 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_manager;
  local_78._M_unused._M_member_pointer = 0x16;
  local_60 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:752:10)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:752:10)>
             ::_M_manager;
  bVar1 = std::function<bool_(parser::state_&)>::operator()
                    ((function<bool_(parser::state_&)> *)&local_78,ps);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&local_58 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return bVar1;
}

Assistant:

bool space(parser::state& ps) {
		return parser::memoize(22, 
			parser::choice({
				parser::literal(' '),
				parser::literal('\t')}))(ps);
	}